

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void __thiscall
Test_TemplateModifiers_ManyUnknownModifiers::Test_TemplateModifiers_ManyUnknownModifiers
          (Test_TemplateModifiers_ManyUnknownModifiers *this)

{
  value_type local_18;
  Test_TemplateModifiers_ManyUnknownModifiers *local_10;
  Test_TemplateModifiers_ManyUnknownModifiers *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, ManyUnknownModifiers) {
  string tpl_str1 = "{{from_name:x-test=4}} sent you a message";
  const GOOGLE_NAMESPACE::Template* tpl1 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str1, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  string tpl_str2 = "{{from_name:x-test=4}} sent you a message:";
  string expected_out = "me sent you a message:";
  // All those new unknown varnames should cause g_unknown_modifiers
  // to resize.  1111 is an arbitrary large number.
  for (int i = 0; i < 1111; i++) {
    tpl_str2.append("{{from_name:x-" + string(i, 't') + "=4}}");
    expected_out.append("me");
  }
  const GOOGLE_NAMESPACE::Template* tpl2 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str2, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  // Even after the resizing, the references to the unknown
  // modifiers in tpl1 and tpl2 should still be valid.
  GOOGLE_NAMESPACE::TemplateDictionary dict("test");
  dict.SetValue("from_name", "me");
  string out;

  out.clear();
  tpl1->Expand(&out, &dict);
  EXPECT_STREQ("me sent you a message", out.c_str());
  delete tpl1;

  out.clear();
  tpl2->Expand(&out, &dict);
  EXPECT_STREQ(expected_out.c_str(), out.c_str());
  delete tpl2;
}